

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariablesManager.cxx
# Opt level: O0

array<dap::Variable> * __thiscall
cmDebugger::cmDebuggerVariablesManager::HandleVariablesRequest
          (array<dap::Variable> *__return_storage_ptr__,cmDebuggerVariablesManager *this,
          VariablesRequest *request)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>,_false>
  local_38;
  int64_t local_30;
  _Node_iterator_base<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>,_false>
  local_28;
  iterator it;
  VariablesRequest *request_local;
  cmDebuggerVariablesManager *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>,_false>
             )(_Node_iterator_base<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>,_false>
               )request;
  local_30 = dap::integer::operator_cast_to_long(&request->variablesReference);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>_>_>
       ::find(&this->VariablesHandlers,&local_30);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>_>_>
       ::end(&this->VariablesHandlers);
  bVar1 = std::__detail::operator!=(&local_28,&local_38);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>,_false,_false>
                           *)&local_28);
    std::
    function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>
    ::operator()(__return_storage_ptr__,&ppVar2->second,
                 (VariablesRequest *)
                 it.
                 super__Node_iterator_base<std::pair<const_long,_std::function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>_>,_false>
                 ._M_cur);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<dap::Variable,_std::allocator<dap::Variable>_>::vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

dap::array<dap::Variable> cmDebuggerVariablesManager::HandleVariablesRequest(
  dap::VariablesRequest const& request)
{
  auto it = VariablesHandlers.find(request.variablesReference);

  if (it != VariablesHandlers.end()) {
    return it->second(request);
  }

  return dap::array<dap::Variable>();
}